

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::SubdivPatch1MBIntersectorK<8>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  GridSOA *pGVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  ulong uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 (*pauVar73) [16];
  long lVar74;
  long lVar75;
  int iVar76;
  AABBNodeMB4D *node1;
  ulong uVar77;
  long lVar78;
  uint uVar79;
  ulong uVar80;
  undefined1 (*pauVar81) [16];
  ulong uVar82;
  ulong uVar83;
  GridSOA *pGVar84;
  ulong uVar85;
  GridSOA *pGVar86;
  ulong uVar87;
  undefined4 uVar88;
  ulong unaff_R15;
  vint4 bi_1;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar96 [16];
  float fVar95;
  float fVar105;
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar99 [32];
  undefined1 auVar97 [16];
  undefined1 auVar100 [32];
  undefined1 auVar98 [16];
  float fVar107;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  vint4 bi;
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 ai;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int iStack_1568;
  undefined1 local_1540 [16];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  GridSOA *local_1468;
  ulong local_1460;
  ulong local_1458;
  RTCFilterFunctionNArguments local_1450;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [32];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  GridSOA **local_1260;
  undefined1 local_1240 [32];
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float local_1200 [4];
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar81 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12d0._4_4_ = fVar1;
  local_12d0._0_4_ = fVar1;
  local_12d0._8_4_ = fVar1;
  local_12d0._12_4_ = fVar1;
  auVar138 = ZEXT1664(local_12d0);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_12e0._4_4_ = fVar2;
  local_12e0._0_4_ = fVar2;
  local_12e0._8_4_ = fVar2;
  local_12e0._12_4_ = fVar2;
  auVar142 = ZEXT1664(local_12e0);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_12f0._4_4_ = fVar3;
  local_12f0._0_4_ = fVar3;
  local_12f0._8_4_ = fVar3;
  local_12f0._12_4_ = fVar3;
  auVar146 = ZEXT1664(local_12f0);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar85 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar87 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar80 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar76 = (tray->tfar).field_0.i[k];
  auVar94 = ZEXT1664(CONCAT412(iVar76,CONCAT48(iVar76,CONCAT44(iVar76,iVar76))));
  local_1300._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1300._8_4_ = -fVar1;
  local_1300._12_4_ = -fVar1;
  auVar149 = ZEXT1664(local_1300);
  local_1310._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1310._8_4_ = -fVar2;
  local_1310._12_4_ = -fVar2;
  auVar153 = ZEXT1664(local_1310);
  local_1320._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_1320._8_4_ = -fVar3;
  local_1320._12_4_ = -fVar3;
  auVar156 = ZEXT1664(local_1320);
  iVar76 = (tray->tnear).field_0.i[k];
  local_1330._4_4_ = iVar76;
  local_1330._0_4_ = iVar76;
  local_1330._8_4_ = iVar76;
  local_1330._12_4_ = iVar76;
  auVar158 = ZEXT1664(local_1330);
  iVar76 = 1 << ((uint)k & 0x1f);
  auVar99._4_4_ = iVar76;
  auVar99._0_4_ = iVar76;
  auVar99._8_4_ = iVar76;
  auVar99._12_4_ = iVar76;
  auVar99._16_4_ = iVar76;
  auVar99._20_4_ = iVar76;
  auVar99._24_4_ = iVar76;
  auVar99._28_4_ = iVar76;
  auVar89 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar99 = vpand_avx2(auVar99,auVar89);
  local_1160 = vpcmpeqd_avx2(auVar99,auVar89);
  while (pauVar81 != (undefined1 (*) [16])&local_fa0) {
    pauVar73 = pauVar81 + -1;
    pauVar81 = pauVar81 + -1;
    if (*(float *)(*pauVar73 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar82 = *(ulong *)*pauVar81;
      do {
        if ((uVar82 & 8) == 0) {
          uVar77 = uVar82 & 0xfffffffffffffff0;
          uVar88 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar96._4_4_ = uVar88;
          auVar96._0_4_ = uVar88;
          auVar96._8_4_ = uVar88;
          auVar96._12_4_ = uVar88;
          auVar97 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar77 + 0x80 + uVar85),auVar96,
                                    *(undefined1 (*) [16])(uVar77 + 0x20 + uVar85));
          auVar97 = vfmadd213ps_fma(auVar97,auVar138._0_16_,auVar149._0_16_);
          auVar111 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar77 + 0x80 + uVar87),auVar96,
                                     *(undefined1 (*) [16])(uVar77 + 0x20 + uVar87));
          auVar111 = vfmadd213ps_fma(auVar111,auVar142._0_16_,auVar153._0_16_);
          auVar97 = vpmaxsd_avx(auVar97,auVar111);
          auVar111 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar77 + 0x80 + uVar80),auVar96,
                                     *(undefined1 (*) [16])(uVar77 + 0x20 + uVar80));
          auVar111 = vfmadd213ps_fma(auVar111,auVar146._0_16_,auVar156._0_16_);
          auVar111 = vpmaxsd_avx(auVar111,auVar158._0_16_);
          auVar116 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar77 + 0x80 + (uVar85 ^ 0x10)),auVar96
                                     ,*(undefined1 (*) [16])(uVar77 + 0x20 + (uVar85 ^ 0x10)));
          local_12c0 = vpmaxsd_avx(auVar97,auVar111);
          auVar97 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar77 + 0x80 + (uVar87 ^ 0x10)),auVar96,
                                    *(undefined1 (*) [16])(uVar77 + 0x20 + (uVar87 ^ 0x10)));
          auVar111 = vfmadd213ps_fma(auVar116,auVar138._0_16_,auVar149._0_16_);
          auVar97 = vfmadd213ps_fma(auVar97,auVar142._0_16_,auVar153._0_16_);
          auVar97 = vpminsd_avx(auVar111,auVar97);
          auVar111 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar77 + 0x80 + (uVar80 ^ 0x10)),auVar96
                                     ,*(undefined1 (*) [16])(uVar77 + 0x20 + (uVar80 ^ 0x10)));
          auVar111 = vfmadd213ps_fma(auVar111,auVar146._0_16_,auVar156._0_16_);
          auVar111 = vpminsd_avx(auVar111,auVar94._0_16_);
          auVar97 = vpminsd_avx(auVar97,auVar111);
          if (((uint)uVar82 & 7) == 6) {
            auVar111 = vcmpps_avx(local_12c0,auVar97,2);
            auVar97 = vcmpps_avx(*(undefined1 (*) [16])(uVar77 + 0xe0),auVar96,2);
            auVar116 = vcmpps_avx(auVar96,*(undefined1 (*) [16])(uVar77 + 0xf0),1);
            auVar97 = vandps_avx(auVar97,auVar116);
            auVar97 = vandps_avx(auVar97,auVar111);
          }
          else {
            auVar97 = vcmpps_avx(local_12c0,auVar97,2);
          }
          auVar97 = vpslld_avx(auVar97,0x1f);
          uVar88 = vmovmskps_avx(auVar97);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar88);
        }
        if ((uVar82 & 8) == 0) {
          if (unaff_R15 == 0) {
            iStack_1568 = 4;
          }
          else {
            uVar77 = uVar82 & 0xfffffffffffffff0;
            lVar78 = 0;
            for (uVar82 = unaff_R15; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
              lVar78 = lVar78 + 1;
            }
            iStack_1568 = 0;
            uVar83 = unaff_R15 - 1 & unaff_R15;
            uVar82 = *(ulong *)(uVar77 + lVar78 * 8);
            if (uVar83 != 0) {
              uVar13 = *(uint *)(local_12c0 + lVar78 * 4);
              lVar78 = 0;
              for (uVar40 = uVar83; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                lVar78 = lVar78 + 1;
              }
              uVar83 = uVar83 - 1 & uVar83;
              uVar40 = *(ulong *)(uVar77 + lVar78 * 8);
              uVar79 = *(uint *)(local_12c0 + lVar78 * 4);
              if (uVar83 == 0) {
                if (uVar13 < uVar79) {
                  *(ulong *)*pauVar81 = uVar40;
                  *(uint *)(*pauVar81 + 8) = uVar79;
                  pauVar81 = pauVar81 + 1;
                }
                else {
                  *(ulong *)*pauVar81 = uVar82;
                  *(uint *)(*pauVar81 + 8) = uVar13;
                  pauVar81 = pauVar81 + 1;
                  uVar82 = uVar40;
                }
              }
              else {
                auVar97._8_8_ = 0;
                auVar97._0_8_ = uVar82;
                auVar97 = vpunpcklqdq_avx(auVar97,ZEXT416(uVar13));
                auVar111._8_8_ = 0;
                auVar111._0_8_ = uVar40;
                auVar111 = vpunpcklqdq_avx(auVar111,ZEXT416(uVar79));
                lVar78 = 0;
                for (uVar82 = uVar83; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000)
                {
                  lVar78 = lVar78 + 1;
                }
                uVar83 = uVar83 - 1 & uVar83;
                auVar116._8_8_ = 0;
                auVar116._0_8_ = *(ulong *)(uVar77 + lVar78 * 8);
                auVar96 = vpunpcklqdq_avx(auVar116,ZEXT416(*(uint *)(local_12c0 + lVar78 * 4)));
                auVar116 = vpcmpgtd_avx(auVar111,auVar97);
                if (uVar83 == 0) {
                  auVar127 = vpshufd_avx(auVar116,0xaa);
                  auVar116 = vblendvps_avx(auVar111,auVar97,auVar127);
                  auVar97 = vblendvps_avx(auVar97,auVar111,auVar127);
                  auVar111 = vpcmpgtd_avx(auVar96,auVar116);
                  auVar127 = vpshufd_avx(auVar111,0xaa);
                  auVar111 = vblendvps_avx(auVar96,auVar116,auVar127);
                  auVar116 = vblendvps_avx(auVar116,auVar96,auVar127);
                  auVar96 = vpcmpgtd_avx(auVar116,auVar97);
                  auVar127 = vpshufd_avx(auVar96,0xaa);
                  auVar96 = vblendvps_avx(auVar116,auVar97,auVar127);
                  auVar97 = vblendvps_avx(auVar97,auVar116,auVar127);
                  *pauVar81 = auVar97;
                  pauVar81[1] = auVar96;
                  uVar82 = auVar111._0_8_;
                  pauVar81 = pauVar81 + 2;
                }
                else {
                  lVar78 = 0;
                  for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
                    lVar78 = lVar78 + 1;
                  }
                  auVar127._8_8_ = 0;
                  auVar127._0_8_ = *(ulong *)(uVar77 + lVar78 * 8);
                  auVar98 = vpunpcklqdq_avx(auVar127,ZEXT416(*(uint *)(local_12c0 + lVar78 * 4)));
                  auVar127 = vpshufd_avx(auVar116,0xaa);
                  auVar116 = vblendvps_avx(auVar111,auVar97,auVar127);
                  auVar97 = vblendvps_avx(auVar97,auVar111,auVar127);
                  auVar111 = vpcmpgtd_avx(auVar98,auVar96);
                  auVar127 = vpshufd_avx(auVar111,0xaa);
                  auVar111 = vblendvps_avx(auVar98,auVar96,auVar127);
                  auVar96 = vblendvps_avx(auVar96,auVar98,auVar127);
                  auVar127 = vpcmpgtd_avx(auVar96,auVar97);
                  auVar98 = vpshufd_avx(auVar127,0xaa);
                  auVar127 = vblendvps_avx(auVar96,auVar97,auVar98);
                  auVar97 = vblendvps_avx(auVar97,auVar96,auVar98);
                  auVar96 = vpcmpgtd_avx(auVar111,auVar116);
                  auVar98 = vpshufd_avx(auVar96,0xaa);
                  auVar96 = vblendvps_avx(auVar111,auVar116,auVar98);
                  auVar111 = vblendvps_avx(auVar116,auVar111,auVar98);
                  auVar116 = vpcmpgtd_avx(auVar127,auVar111);
                  auVar98 = vpshufd_avx(auVar116,0xaa);
                  auVar116 = vblendvps_avx(auVar127,auVar111,auVar98);
                  auVar111 = vblendvps_avx(auVar111,auVar127,auVar98);
                  *pauVar81 = auVar97;
                  pauVar81[1] = auVar111;
                  pauVar81[2] = auVar116;
                  uVar82 = auVar96._0_8_;
                  pauVar81 = pauVar81 + 3;
                }
              }
            }
          }
        }
        else {
          iStack_1568 = 6;
        }
      } while (iStack_1568 == 0);
      if (iStack_1568 == 6) {
        if (((uint)uVar82 & 0xf) == 8) {
          pGVar14 = (pre->super_Precalculations).grid;
          fVar1 = (float)(*(int *)(pGVar14 + 8) - 1) * *(float *)(ray + k * 4 + 0xe0);
          uVar13 = *(uint *)(pGVar14 + 0xc);
          local_1460 = (ulong)uVar13;
          auVar97 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
          auVar97 = vminss_avx(auVar97,ZEXT416((uint)((float)(*(int *)(pGVar14 + 8) - 1) + -1.0)));
          auVar116 = vmaxss_avx(ZEXT816(0) << 0x20,auVar97);
          uVar79 = *(uint *)(pGVar14 + 0x10);
          local_1458 = (ulong)uVar79;
          lVar78 = (long)(int)auVar116._0_4_ * (ulong)*(uint *)(pGVar14 + 0x28) +
                   (ulong)*(uint *)(pGVar14 + 0x24);
          uVar82 = uVar82 >> 4;
          lVar74 = uVar82 * 4 + lVar78;
          lVar75 = uVar82 * 4 + lVar78 + 0x2c;
          auVar97 = *(undefined1 (*) [16])(pGVar14 + local_1460 * 4 + lVar74 + 0x2c);
          auVar111 = auVar97;
          if (2 < local_1458) {
            auVar111 = *(undefined1 (*) [16])(pGVar14 + local_1460 * 8 + lVar75);
          }
          local_1540 = *(undefined1 (*) [16])(pGVar14 + uVar82 * 4 + lVar78 + 0x2c);
          if (local_1460 == 2) {
            local_1540 = vshufps_avx(local_1540,local_1540,0x54);
            auVar97 = vshufps_avx(auVar97,auVar97,0x54);
            auVar111 = vshufps_avx(auVar111,auVar111,0x54);
          }
          uVar82 = (ulong)*(uint *)(pGVar14 + 0x14);
          pGVar84 = pGVar14 + uVar82 * 4 + lVar74 + 0x2c;
          auVar96 = *(undefined1 (*) [16])(pGVar84 + local_1460 * 4);
          auVar127 = auVar96;
          if (2 < uVar79) {
            auVar127 = *(undefined1 (*) [16])(pGVar84 + local_1460 * 8);
          }
          auVar98 = *(undefined1 (*) [16])pGVar84;
          if (uVar13 == 2) {
            auVar98 = vshufps_avx(auVar98,auVar98,0x54);
            auVar96 = vshufps_avx(auVar96,auVar96,0x54);
            auVar127 = vshufps_avx(auVar127,auVar127,0x54);
          }
          pGVar86 = pGVar14 + uVar82 * 8 + lVar74 + 0x2c;
          auVar6 = *(undefined1 (*) [16])(pGVar86 + local_1460 * 4);
          auVar154 = auVar6;
          if (2 < uVar79) {
            auVar154 = *(undefined1 (*) [16])(pGVar86 + local_1460 * 8);
          }
          auVar7 = *(undefined1 (*) [16])pGVar86;
          if (uVar13 == 2) {
            auVar7 = vshufps_avx(auVar7,auVar7,0x54);
            auVar6 = vshufps_avx(auVar6,auVar6,0x54);
            auVar154 = vshufps_avx(auVar154,auVar154,0x54);
          }
          uVar77 = (ulong)(*(uint *)(pGVar14 + 0x28) & 0xfffffffc);
          auVar8 = *(undefined1 (*) [16])(pGVar14 + local_1460 * 4 + uVar77 + lVar75);
          auVar120 = auVar8;
          if (2 < uVar79) {
            auVar120 = *(undefined1 (*) [16])(pGVar14 + local_1460 * 8 + uVar77 + lVar75);
          }
          auVar9 = *(undefined1 (*) [16])(pGVar14 + uVar77 + lVar75);
          if (uVar13 == 2) {
            auVar9 = vshufps_avx(auVar9,auVar9,0x54);
            auVar8 = vshufps_avx(auVar8,auVar8,0x54);
            auVar120 = vshufps_avx(auVar120,auVar120,0x54);
          }
          pGVar84 = pGVar84 + uVar77;
          auVar10 = *(undefined1 (*) [16])(pGVar84 + local_1460 * 4);
          auVar168 = auVar10;
          if (2 < uVar79) {
            auVar168 = *(undefined1 (*) [16])(pGVar84 + local_1460 * 8);
          }
          auVar11 = *(undefined1 (*) [16])pGVar84;
          if (uVar13 == 2) {
            auVar11 = vshufps_avx(auVar11,auVar11,0x54);
            auVar10 = vshufps_avx(auVar10,auVar10,0x54);
            auVar168 = vshufps_avx(auVar168,auVar168,0x54);
          }
          pGVar86 = pGVar86 + uVar77;
          auVar121 = *(undefined1 (*) [16])pGVar86;
          auVar12 = *(undefined1 (*) [16])(pGVar86 + local_1460 * 4);
          auVar143 = auVar12;
          if (2 < uVar79) {
            auVar143 = *(undefined1 (*) [16])(pGVar86 + local_1460 * 8);
          }
          fVar1 = fVar1 - auVar116._0_4_;
          auVar89._16_16_ = auVar97;
          auVar89._0_16_ = local_1540;
          auVar112._16_16_ = auVar111;
          auVar112._0_16_ = auVar97;
          auVar35 = vunpcklps_avx(auVar89,auVar112);
          auVar99 = vshufps_avx(auVar89,auVar89,0xa5);
          auVar89 = vshufps_avx(auVar112,auVar112,0x94);
          auVar117._16_16_ = auVar96;
          auVar117._0_16_ = auVar98;
          auVar133._16_16_ = auVar127;
          auVar133._0_16_ = auVar96;
          auVar36 = vunpcklps_avx(auVar117,auVar133);
          auVar112 = vshufps_avx(auVar117,auVar117,0xa5);
          auVar117 = vshufps_avx(auVar133,auVar133,0x94);
          auVar134._16_16_ = auVar6;
          auVar134._0_16_ = auVar7;
          auVar141._16_16_ = auVar154;
          auVar141._0_16_ = auVar6;
          auVar37 = vunpcklps_avx(auVar134,auVar141);
          auVar133 = vshufps_avx(auVar134,auVar134,0xa5);
          auVar134 = vshufps_avx(auVar141,auVar141,0x94);
          auVar136._16_16_ = auVar8;
          auVar136._0_16_ = auVar9;
          auVar150._16_16_ = auVar120;
          auVar150._0_16_ = auVar8;
          auVar38 = vunpcklps_avx(auVar136,auVar150);
          auVar136 = vshufps_avx(auVar136,auVar136,0xa5);
          auVar150 = vshufps_avx(auVar150,auVar150,0x94);
          auVar151._16_16_ = auVar10;
          auVar151._0_16_ = auVar11;
          auVar160._16_16_ = auVar168;
          auVar160._0_16_ = auVar10;
          auVar39 = vunpcklps_avx(auVar151,auVar160);
          auVar151 = vshufps_avx(auVar151,auVar151,0xa5);
          auVar141 = vshufps_avx(auVar160,auVar160,0x94);
          if (uVar13 == 2) {
            auVar121 = vshufps_avx(auVar121,auVar121,0x54);
            auVar12 = vshufps_avx(auVar12,auVar12,0x54);
            auVar143 = vshufps_avx(auVar143,auVar143,0x54);
          }
          auVar161._16_16_ = auVar12;
          auVar161._0_16_ = auVar121;
          auVar147._16_16_ = auVar143;
          auVar147._0_16_ = auVar12;
          fVar2 = 1.0 - fVar1;
          auVar144._4_4_ = fVar2;
          auVar144._0_4_ = fVar2;
          auVar144._8_4_ = fVar2;
          auVar144._12_4_ = fVar2;
          auVar144._16_4_ = fVar2;
          auVar144._20_4_ = fVar2;
          auVar144._24_4_ = fVar2;
          auVar144._28_4_ = fVar2;
          auVar41._4_4_ = fVar1 * auVar38._4_4_;
          auVar41._0_4_ = fVar1 * auVar38._0_4_;
          auVar41._8_4_ = fVar1 * auVar38._8_4_;
          auVar41._12_4_ = fVar1 * auVar38._12_4_;
          auVar41._16_4_ = fVar1 * auVar38._16_4_;
          auVar41._20_4_ = fVar1 * auVar38._20_4_;
          auVar41._24_4_ = fVar1 * auVar38._24_4_;
          auVar41._28_4_ = auVar38._28_4_;
          auVar97 = vfmadd213ps_fma(auVar35,auVar144,auVar41);
          auVar35._4_4_ = fVar1 * auVar39._4_4_;
          auVar35._0_4_ = fVar1 * auVar39._0_4_;
          auVar35._8_4_ = fVar1 * auVar39._8_4_;
          auVar35._12_4_ = fVar1 * auVar39._12_4_;
          auVar35._16_4_ = fVar1 * auVar39._16_4_;
          auVar35._20_4_ = fVar1 * auVar39._20_4_;
          auVar35._24_4_ = fVar1 * auVar39._24_4_;
          auVar35._28_4_ = auVar38._28_4_;
          auVar111 = vfmadd213ps_fma(auVar36,auVar144,auVar35);
          auVar35 = vunpcklps_avx(auVar161,auVar147);
          auVar36._4_4_ = fVar1 * auVar35._4_4_;
          auVar36._0_4_ = fVar1 * auVar35._0_4_;
          auVar36._8_4_ = fVar1 * auVar35._8_4_;
          auVar36._12_4_ = fVar1 * auVar35._12_4_;
          auVar36._16_4_ = fVar1 * auVar35._16_4_;
          auVar36._20_4_ = fVar1 * auVar35._20_4_;
          uVar88 = auVar35._28_4_;
          auVar36._24_4_ = fVar1 * auVar35._24_4_;
          auVar36._28_4_ = uVar88;
          auVar116 = vfmadd213ps_fma(auVar37,auVar144,auVar36);
          auVar37._4_4_ = fVar1 * auVar136._4_4_;
          auVar37._0_4_ = fVar1 * auVar136._0_4_;
          auVar37._8_4_ = fVar1 * auVar136._8_4_;
          auVar37._12_4_ = fVar1 * auVar136._12_4_;
          auVar37._16_4_ = fVar1 * auVar136._16_4_;
          auVar37._20_4_ = fVar1 * auVar136._20_4_;
          auVar37._24_4_ = fVar1 * auVar136._24_4_;
          auVar37._28_4_ = auVar136._28_4_;
          auVar96 = vfmadd213ps_fma(auVar99,auVar144,auVar37);
          local_1468 = pGVar14 + uVar82 * 0xc + lVar74 + 0x2c;
          auVar99 = vshufps_avx(auVar161,auVar161,0xa5);
          auVar136 = vshufps_avx(auVar147,auVar147,0x94);
          local_1420 = auVar151._0_4_;
          fStack_141c = auVar151._4_4_;
          fStack_1418 = auVar151._8_4_;
          fStack_1414 = auVar151._12_4_;
          fStack_1410 = auVar151._16_4_;
          fStack_140c = auVar151._20_4_;
          fStack_1408 = auVar151._24_4_;
          auVar38._4_4_ = fVar1 * fStack_141c;
          auVar38._0_4_ = fVar1 * local_1420;
          auVar38._8_4_ = fVar1 * fStack_1418;
          auVar38._12_4_ = fVar1 * fStack_1414;
          auVar38._16_4_ = fVar1 * fStack_1410;
          auVar38._20_4_ = fVar1 * fStack_140c;
          auVar38._24_4_ = fVar1 * fStack_1408;
          auVar38._28_4_ = uVar88;
          auVar39._4_4_ = fVar1 * auVar99._4_4_;
          auVar39._0_4_ = fVar1 * auVar99._0_4_;
          auVar39._8_4_ = fVar1 * auVar99._8_4_;
          auVar39._12_4_ = fVar1 * auVar99._12_4_;
          auVar39._16_4_ = fVar1 * auVar99._16_4_;
          auVar39._20_4_ = fVar1 * auVar99._20_4_;
          auVar39._24_4_ = fVar1 * auVar99._24_4_;
          auVar39._28_4_ = auVar99._28_4_;
          auVar127 = vfmadd213ps_fma(auVar112,auVar144,auVar38);
          auVar98 = vfmadd213ps_fma(auVar133,auVar144,auVar39);
          local_14e0 = auVar150._0_4_;
          fStack_14dc = auVar150._4_4_;
          fStack_14d8 = auVar150._8_4_;
          fStack_14d4 = auVar150._12_4_;
          fStack_14d0 = auVar150._16_4_;
          fStack_14cc = auVar150._20_4_;
          fStack_14c8 = auVar150._24_4_;
          auVar42._4_4_ = fVar1 * fStack_14dc;
          auVar42._0_4_ = fVar1 * local_14e0;
          auVar42._8_4_ = fVar1 * fStack_14d8;
          auVar42._12_4_ = fVar1 * fStack_14d4;
          auVar42._16_4_ = fVar1 * fStack_14d0;
          auVar42._20_4_ = fVar1 * fStack_14cc;
          auVar42._24_4_ = fVar1 * fStack_14c8;
          auVar42._28_4_ = auVar99._28_4_;
          local_1400._0_4_ = auVar141._0_4_;
          local_1400._4_4_ = auVar141._4_4_;
          fStack_13f8 = auVar141._8_4_;
          fStack_13f4 = auVar141._12_4_;
          fStack_13f0 = auVar141._16_4_;
          fStack_13ec = auVar141._20_4_;
          fStack_13e8 = auVar141._24_4_;
          auVar43._4_4_ = fVar1 * (float)local_1400._4_4_;
          auVar43._0_4_ = fVar1 * (float)local_1400._0_4_;
          auVar43._8_4_ = fVar1 * fStack_13f8;
          auVar43._12_4_ = fVar1 * fStack_13f4;
          auVar43._16_4_ = fVar1 * fStack_13f0;
          auVar43._20_4_ = fVar1 * fStack_13ec;
          auVar43._24_4_ = fVar1 * fStack_13e8;
          auVar43._28_4_ = uVar88;
          auVar44._4_4_ = fVar1 * auVar136._4_4_;
          auVar44._0_4_ = fVar1 * auVar136._0_4_;
          auVar44._8_4_ = fVar1 * auVar136._8_4_;
          auVar44._12_4_ = fVar1 * auVar136._12_4_;
          auVar44._16_4_ = fVar1 * auVar136._16_4_;
          auVar44._20_4_ = fVar1 * auVar136._20_4_;
          auVar44._24_4_ = fVar1 * auVar136._24_4_;
          auVar44._28_4_ = auVar136._28_4_;
          auVar6 = vfmadd213ps_fma(auVar89,auVar144,auVar42);
          auVar154 = vfmadd213ps_fma(auVar117,auVar144,auVar43);
          local_13c0._4_4_ = *(uint *)(pGVar14 + 0x18);
          local_13e0._4_4_ = *(undefined4 *)(pGVar14 + 0x1c);
          local_1260 = &local_1468;
          uVar88 = *(undefined4 *)(ray + k * 4);
          auVar90._4_4_ = uVar88;
          auVar90._0_4_ = uVar88;
          auVar90._8_4_ = uVar88;
          auVar90._12_4_ = uVar88;
          auVar90._16_4_ = uVar88;
          auVar90._20_4_ = uVar88;
          auVar90._24_4_ = uVar88;
          auVar90._28_4_ = uVar88;
          uVar88 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar157._4_4_ = uVar88;
          auVar157._0_4_ = uVar88;
          auVar157._8_4_ = uVar88;
          auVar157._12_4_ = uVar88;
          auVar157._16_4_ = uVar88;
          auVar157._20_4_ = uVar88;
          auVar157._24_4_ = uVar88;
          auVar157._28_4_ = uVar88;
          auVar7 = vfmadd213ps_fma(auVar134,auVar144,auVar44);
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar145._4_4_ = uVar4;
          auVar145._0_4_ = uVar4;
          auVar145._8_4_ = uVar4;
          auVar145._12_4_ = uVar4;
          auVar145._16_4_ = uVar4;
          auVar145._20_4_ = uVar4;
          auVar145._24_4_ = uVar4;
          auVar145._28_4_ = uVar4;
          auVar133 = vsubps_avx(ZEXT1632(auVar97),auVar90);
          auVar134 = vsubps_avx(ZEXT1632(auVar111),auVar157);
          auVar99 = vsubps_avx(ZEXT1632(auVar116),auVar145);
          auVar89 = vsubps_avx(ZEXT1632(auVar96),auVar90);
          auVar112 = vsubps_avx(ZEXT1632(auVar127),auVar157);
          auVar117 = vsubps_avx(ZEXT1632(auVar98),auVar145);
          auVar136 = vsubps_avx(ZEXT1632(auVar6),auVar90);
          auVar150 = vsubps_avx(ZEXT1632(auVar154),auVar157);
          auVar151 = vsubps_avx(ZEXT1632(auVar7),auVar145);
          auVar141 = vsubps_avx(auVar136,auVar133);
          local_13a0 = vsubps_avx(auVar150,auVar134);
          _local_1400 = vsubps_avx(auVar151,auVar99);
          auVar91._0_4_ = auVar136._0_4_ + auVar133._0_4_;
          auVar91._4_4_ = auVar136._4_4_ + auVar133._4_4_;
          auVar91._8_4_ = auVar136._8_4_ + auVar133._8_4_;
          auVar91._12_4_ = auVar136._12_4_ + auVar133._12_4_;
          auVar91._16_4_ = auVar136._16_4_ + auVar133._16_4_;
          auVar91._20_4_ = auVar136._20_4_ + auVar133._20_4_;
          auVar91._24_4_ = auVar136._24_4_ + auVar133._24_4_;
          fVar95 = auVar133._28_4_;
          auVar91._28_4_ = auVar136._28_4_ + fVar95;
          auVar118._0_4_ = auVar150._0_4_ + auVar134._0_4_;
          auVar118._4_4_ = auVar150._4_4_ + auVar134._4_4_;
          auVar118._8_4_ = auVar150._8_4_ + auVar134._8_4_;
          auVar118._12_4_ = auVar150._12_4_ + auVar134._12_4_;
          auVar118._16_4_ = auVar150._16_4_ + auVar134._16_4_;
          auVar118._20_4_ = auVar150._20_4_ + auVar134._20_4_;
          auVar118._24_4_ = auVar150._24_4_ + auVar134._24_4_;
          auVar118._28_4_ = auVar150._28_4_ + auVar134._28_4_;
          fVar1 = auVar99._0_4_;
          auVar122._0_4_ = auVar151._0_4_ + fVar1;
          fVar2 = auVar99._4_4_;
          auVar122._4_4_ = auVar151._4_4_ + fVar2;
          fVar3 = auVar99._8_4_;
          auVar122._8_4_ = auVar151._8_4_ + fVar3;
          fVar17 = auVar99._12_4_;
          auVar122._12_4_ = auVar151._12_4_ + fVar17;
          fVar18 = auVar99._16_4_;
          auVar122._16_4_ = auVar151._16_4_ + fVar18;
          fVar19 = auVar99._20_4_;
          auVar122._20_4_ = auVar151._20_4_ + fVar19;
          fVar20 = auVar99._24_4_;
          auVar122._24_4_ = auVar151._24_4_ + fVar20;
          fVar21 = auVar99._28_4_;
          auVar122._28_4_ = auVar151._28_4_ + fVar21;
          auVar45._4_4_ = local_1400._4_4_ * auVar118._4_4_;
          auVar45._0_4_ = local_1400._0_4_ * auVar118._0_4_;
          auVar45._8_4_ = local_1400._8_4_ * auVar118._8_4_;
          auVar45._12_4_ = local_1400._12_4_ * auVar118._12_4_;
          auVar45._16_4_ = local_1400._16_4_ * auVar118._16_4_;
          auVar45._20_4_ = local_1400._20_4_ * auVar118._20_4_;
          auVar45._24_4_ = local_1400._24_4_ * auVar118._24_4_;
          auVar45._28_4_ = uVar88;
          auVar111 = vfmsub231ps_fma(auVar45,local_13a0,auVar122);
          auVar46._4_4_ = auVar141._4_4_ * auVar122._4_4_;
          auVar46._0_4_ = auVar141._0_4_ * auVar122._0_4_;
          auVar46._8_4_ = auVar141._8_4_ * auVar122._8_4_;
          auVar46._12_4_ = auVar141._12_4_ * auVar122._12_4_;
          auVar46._16_4_ = auVar141._16_4_ * auVar122._16_4_;
          auVar46._20_4_ = auVar141._20_4_ * auVar122._20_4_;
          auVar46._24_4_ = auVar141._24_4_ * auVar122._24_4_;
          auVar46._28_4_ = auVar122._28_4_;
          auVar97 = vfmsub231ps_fma(auVar46,_local_1400,auVar91);
          auVar47._4_4_ = local_13a0._4_4_ * auVar91._4_4_;
          auVar47._0_4_ = local_13a0._0_4_ * auVar91._0_4_;
          auVar47._8_4_ = local_13a0._8_4_ * auVar91._8_4_;
          auVar47._12_4_ = local_13a0._12_4_ * auVar91._12_4_;
          auVar47._16_4_ = local_13a0._16_4_ * auVar91._16_4_;
          auVar47._20_4_ = local_13a0._20_4_ * auVar91._20_4_;
          auVar47._24_4_ = local_13a0._24_4_ * auVar91._24_4_;
          auVar47._28_4_ = auVar91._28_4_;
          auVar116 = vfmsub231ps_fma(auVar47,auVar141,auVar118);
          uVar88 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar155._4_4_ = uVar88;
          auVar155._0_4_ = uVar88;
          auVar155._8_4_ = uVar88;
          auVar155._12_4_ = uVar88;
          auVar155._16_4_ = uVar88;
          auVar155._20_4_ = uVar88;
          auVar155._24_4_ = uVar88;
          auVar155._28_4_ = uVar88;
          fStack_141c = *(float *)(ray + k * 4 + 0xc0);
          auVar92._0_4_ = fStack_141c * auVar116._0_4_;
          auVar92._4_4_ = fStack_141c * auVar116._4_4_;
          auVar92._8_4_ = fStack_141c * auVar116._8_4_;
          auVar92._12_4_ = fStack_141c * auVar116._12_4_;
          auVar92._16_4_ = fStack_141c * 0.0;
          auVar92._20_4_ = fStack_141c * 0.0;
          auVar92._24_4_ = fStack_141c * 0.0;
          auVar92._28_4_ = 0;
          auVar97 = vfmadd231ps_fma(auVar92,auVar155,ZEXT1632(auVar97));
          uVar88 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar169._4_4_ = uVar88;
          auVar169._0_4_ = uVar88;
          auVar169._8_4_ = uVar88;
          auVar169._12_4_ = uVar88;
          auVar169._16_4_ = uVar88;
          auVar169._20_4_ = uVar88;
          auVar169._24_4_ = uVar88;
          auVar169._28_4_ = uVar88;
          local_12c0 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar169,ZEXT1632(auVar111));
          local_10e0 = vsubps_avx(auVar134,auVar112);
          local_1100 = vsubps_avx(auVar99,auVar117);
          auVar128._0_4_ = auVar112._0_4_ + auVar134._0_4_;
          auVar128._4_4_ = auVar112._4_4_ + auVar134._4_4_;
          auVar128._8_4_ = auVar112._8_4_ + auVar134._8_4_;
          auVar128._12_4_ = auVar112._12_4_ + auVar134._12_4_;
          auVar128._16_4_ = auVar112._16_4_ + auVar134._16_4_;
          auVar128._20_4_ = auVar112._20_4_ + auVar134._20_4_;
          auVar128._24_4_ = auVar112._24_4_ + auVar134._24_4_;
          auVar128._28_4_ = auVar112._28_4_ + auVar134._28_4_;
          auVar123._0_4_ = auVar117._0_4_ + fVar1;
          auVar123._4_4_ = auVar117._4_4_ + fVar2;
          auVar123._8_4_ = auVar117._8_4_ + fVar3;
          auVar123._12_4_ = auVar117._12_4_ + fVar17;
          auVar123._16_4_ = auVar117._16_4_ + fVar18;
          auVar123._20_4_ = auVar117._20_4_ + fVar19;
          auVar123._24_4_ = auVar117._24_4_ + fVar20;
          fVar105 = auVar117._28_4_;
          auVar123._28_4_ = fVar105 + fVar21;
          fVar159 = local_1100._0_4_;
          fVar162 = local_1100._4_4_;
          auVar48._4_4_ = fVar162 * auVar128._4_4_;
          auVar48._0_4_ = fVar159 * auVar128._0_4_;
          fVar163 = local_1100._8_4_;
          auVar48._8_4_ = fVar163 * auVar128._8_4_;
          fVar164 = local_1100._12_4_;
          auVar48._12_4_ = fVar164 * auVar128._12_4_;
          fVar165 = local_1100._16_4_;
          auVar48._16_4_ = fVar165 * auVar128._16_4_;
          fVar166 = local_1100._20_4_;
          auVar48._20_4_ = fVar166 * auVar128._20_4_;
          fVar167 = local_1100._24_4_;
          auVar48._24_4_ = fVar167 * auVar128._24_4_;
          auVar48._28_4_ = fVar21;
          auVar111 = vfmsub231ps_fma(auVar48,local_10e0,auVar123);
          auVar35 = vsubps_avx(auVar133,auVar89);
          fVar21 = auVar35._0_4_;
          fVar23 = auVar35._4_4_;
          auVar49._4_4_ = auVar123._4_4_ * fVar23;
          auVar49._0_4_ = auVar123._0_4_ * fVar21;
          fVar25 = auVar35._8_4_;
          auVar49._8_4_ = auVar123._8_4_ * fVar25;
          fVar27 = auVar35._12_4_;
          auVar49._12_4_ = auVar123._12_4_ * fVar27;
          fVar29 = auVar35._16_4_;
          auVar49._16_4_ = auVar123._16_4_ * fVar29;
          fVar31 = auVar35._20_4_;
          auVar49._20_4_ = auVar123._20_4_ * fVar31;
          fVar33 = auVar35._24_4_;
          auVar49._24_4_ = auVar123._24_4_ * fVar33;
          auVar49._28_4_ = fVar105;
          auVar124._0_4_ = auVar133._0_4_ + auVar89._0_4_;
          auVar124._4_4_ = auVar133._4_4_ + auVar89._4_4_;
          auVar124._8_4_ = auVar133._8_4_ + auVar89._8_4_;
          auVar124._12_4_ = auVar133._12_4_ + auVar89._12_4_;
          auVar124._16_4_ = auVar133._16_4_ + auVar89._16_4_;
          auVar124._20_4_ = auVar133._20_4_ + auVar89._20_4_;
          auVar124._24_4_ = auVar133._24_4_ + auVar89._24_4_;
          auVar124._28_4_ = fVar95 + auVar89._28_4_;
          auVar97 = vfmsub231ps_fma(auVar49,local_1100,auVar124);
          fVar22 = local_10e0._0_4_;
          fVar24 = local_10e0._4_4_;
          auVar50._4_4_ = auVar124._4_4_ * fVar24;
          auVar50._0_4_ = auVar124._0_4_ * fVar22;
          fVar26 = local_10e0._8_4_;
          auVar50._8_4_ = auVar124._8_4_ * fVar26;
          fVar28 = local_10e0._12_4_;
          auVar50._12_4_ = auVar124._12_4_ * fVar28;
          fVar30 = local_10e0._16_4_;
          auVar50._16_4_ = auVar124._16_4_ * fVar30;
          fVar32 = local_10e0._20_4_;
          auVar50._20_4_ = auVar124._20_4_ * fVar32;
          fVar34 = local_10e0._24_4_;
          auVar50._24_4_ = auVar124._24_4_ * fVar34;
          auVar50._28_4_ = auVar124._28_4_;
          auVar116 = vfmsub231ps_fma(auVar50,auVar35,auVar128);
          auVar51._4_4_ = fStack_141c * auVar116._4_4_;
          auVar51._0_4_ = fStack_141c * auVar116._0_4_;
          auVar51._8_4_ = fStack_141c * auVar116._8_4_;
          auVar51._12_4_ = fStack_141c * auVar116._12_4_;
          auVar51._16_4_ = fStack_141c * 0.0;
          auVar51._20_4_ = fStack_141c * 0.0;
          auVar51._24_4_ = fStack_141c * 0.0;
          auVar51._28_4_ = fVar95;
          auVar97 = vfmadd231ps_fma(auVar51,auVar155,ZEXT1632(auVar97));
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar169,ZEXT1632(auVar111));
          auVar36 = vsubps_avx(auVar89,auVar136);
          auVar113._0_4_ = auVar136._0_4_ + auVar89._0_4_;
          auVar113._4_4_ = auVar136._4_4_ + auVar89._4_4_;
          auVar113._8_4_ = auVar136._8_4_ + auVar89._8_4_;
          auVar113._12_4_ = auVar136._12_4_ + auVar89._12_4_;
          auVar113._16_4_ = auVar136._16_4_ + auVar89._16_4_;
          auVar113._20_4_ = auVar136._20_4_ + auVar89._20_4_;
          auVar113._24_4_ = auVar136._24_4_ + auVar89._24_4_;
          auVar113._28_4_ = auVar136._28_4_ + auVar89._28_4_;
          auVar136 = vsubps_avx(auVar112,auVar150);
          auVar129._0_4_ = auVar112._0_4_ + auVar150._0_4_;
          auVar129._4_4_ = auVar112._4_4_ + auVar150._4_4_;
          auVar129._8_4_ = auVar112._8_4_ + auVar150._8_4_;
          auVar129._12_4_ = auVar112._12_4_ + auVar150._12_4_;
          auVar129._16_4_ = auVar112._16_4_ + auVar150._16_4_;
          auVar129._20_4_ = auVar112._20_4_ + auVar150._20_4_;
          auVar129._24_4_ = auVar112._24_4_ + auVar150._24_4_;
          auVar129._28_4_ = auVar112._28_4_ + auVar150._28_4_;
          auVar150 = vsubps_avx(auVar117,auVar151);
          auVar100._0_4_ = auVar117._0_4_ + auVar151._0_4_;
          auVar100._4_4_ = auVar117._4_4_ + auVar151._4_4_;
          auVar100._8_4_ = auVar117._8_4_ + auVar151._8_4_;
          auVar100._12_4_ = auVar117._12_4_ + auVar151._12_4_;
          auVar100._16_4_ = auVar117._16_4_ + auVar151._16_4_;
          auVar100._20_4_ = auVar117._20_4_ + auVar151._20_4_;
          auVar100._24_4_ = auVar117._24_4_ + auVar151._24_4_;
          auVar100._28_4_ = fVar105 + auVar151._28_4_;
          auVar52._4_4_ = auVar150._4_4_ * auVar129._4_4_;
          auVar52._0_4_ = auVar150._0_4_ * auVar129._0_4_;
          auVar52._8_4_ = auVar150._8_4_ * auVar129._8_4_;
          auVar52._12_4_ = auVar150._12_4_ * auVar129._12_4_;
          auVar52._16_4_ = auVar150._16_4_ * auVar129._16_4_;
          auVar52._20_4_ = auVar150._20_4_ * auVar129._20_4_;
          auVar52._24_4_ = auVar150._24_4_ * auVar129._24_4_;
          auVar52._28_4_ = fVar105;
          auVar116 = vfmsub231ps_fma(auVar52,auVar136,auVar100);
          auVar53._4_4_ = auVar100._4_4_ * auVar36._4_4_;
          auVar53._0_4_ = auVar100._0_4_ * auVar36._0_4_;
          auVar53._8_4_ = auVar100._8_4_ * auVar36._8_4_;
          auVar53._12_4_ = auVar100._12_4_ * auVar36._12_4_;
          auVar53._16_4_ = auVar100._16_4_ * auVar36._16_4_;
          auVar53._20_4_ = auVar100._20_4_ * auVar36._20_4_;
          auVar53._24_4_ = auVar100._24_4_ * auVar36._24_4_;
          auVar53._28_4_ = auVar100._28_4_;
          auVar111 = vfmsub231ps_fma(auVar53,auVar150,auVar113);
          auVar54._4_4_ = auVar113._4_4_ * auVar136._4_4_;
          auVar54._0_4_ = auVar113._0_4_ * auVar136._0_4_;
          auVar54._8_4_ = auVar113._8_4_ * auVar136._8_4_;
          auVar54._12_4_ = auVar113._12_4_ * auVar136._12_4_;
          auVar54._16_4_ = auVar113._16_4_ * auVar136._16_4_;
          auVar54._20_4_ = auVar113._20_4_ * auVar136._20_4_;
          auVar54._24_4_ = auVar113._24_4_ * auVar136._24_4_;
          auVar54._28_4_ = auVar113._28_4_;
          auVar96 = vfmsub231ps_fma(auVar54,auVar36,auVar129);
          local_1420 = fStack_141c;
          fStack_1418 = fStack_141c;
          fStack_1414 = fStack_141c;
          fStack_1410 = fStack_141c;
          fStack_140c = fStack_141c;
          fStack_1408 = fStack_141c;
          fStack_1404 = fStack_141c;
          auVar114._0_4_ = fStack_141c * auVar96._0_4_;
          auVar114._4_4_ = fStack_141c * auVar96._4_4_;
          auVar114._8_4_ = fStack_141c * auVar96._8_4_;
          auVar114._12_4_ = fStack_141c * auVar96._12_4_;
          auVar114._16_4_ = fStack_141c * 0.0;
          auVar114._20_4_ = fStack_141c * 0.0;
          auVar114._24_4_ = fStack_141c * 0.0;
          auVar114._28_4_ = 0;
          auVar111 = vfmadd231ps_fma(auVar114,auVar155,ZEXT1632(auVar111));
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar169,ZEXT1632(auVar116));
          auVar98._0_8_ =
               CONCAT44(auVar111._4_4_ + auVar97._4_4_ + local_12c0._4_4_,
                        auVar111._0_4_ + auVar97._0_4_ + local_12c0._0_4_);
          auVar98._8_4_ = auVar111._8_4_ + auVar97._8_4_ + local_12c0._8_4_;
          auVar98._12_4_ = auVar111._12_4_ + auVar97._12_4_ + local_12c0._12_4_;
          auVar132._8_4_ = 0x7fffffff;
          auVar132._0_8_ = 0x7fffffff7fffffff;
          auVar132._12_4_ = 0x7fffffff;
          auVar132._16_4_ = 0x7fffffff;
          auVar132._20_4_ = 0x7fffffff;
          auVar132._24_4_ = 0x7fffffff;
          auVar132._28_4_ = 0x7fffffff;
          local_1140 = ZEXT1632(auVar98);
          auVar151 = local_1140;
          auVar99 = vandps_avx(ZEXT1632(auVar98),auVar132);
          fVar95 = auVar99._0_4_ * 1.1920929e-07;
          fVar105 = auVar99._4_4_ * 1.1920929e-07;
          auVar55._4_4_ = fVar105;
          auVar55._0_4_ = fVar95;
          fVar106 = auVar99._8_4_ * 1.1920929e-07;
          auVar55._8_4_ = fVar106;
          fVar107 = auVar99._12_4_ * 1.1920929e-07;
          auVar55._12_4_ = fVar107;
          fVar108 = auVar99._16_4_ * 1.1920929e-07;
          auVar55._16_4_ = fVar108;
          fVar109 = auVar99._20_4_ * 1.1920929e-07;
          auVar55._20_4_ = fVar109;
          fVar110 = auVar99._24_4_ * 1.1920929e-07;
          auVar55._24_4_ = fVar110;
          auVar55._28_4_ = auVar99._28_4_;
          local_12a0 = ZEXT1632(auVar97);
          auVar89 = vminps_avx(ZEXT1632(local_12c0),local_12a0);
          auVar89 = vminps_avx(auVar89,ZEXT1632(auVar111));
          auVar135._0_8_ = CONCAT44(fVar105,fVar95) ^ 0x8000000080000000;
          auVar135._8_4_ = -fVar106;
          auVar135._12_4_ = -fVar107;
          auVar135._16_4_ = -fVar108;
          auVar135._20_4_ = -fVar109;
          auVar135._24_4_ = -fVar110;
          auVar135._28_4_ = auVar99._28_4_ ^ 0x80000000;
          auVar99 = vcmpps_avx(auVar89,auVar135,5);
          local_1120 = ZEXT1632(local_12c0);
          auVar112 = vmaxps_avx(ZEXT1632(local_12c0),local_12a0);
          auVar89 = vmaxps_avx(auVar112,ZEXT1632(auVar111));
          auVar89 = vcmpps_avx(auVar89,auVar55,2);
          auVar117 = vorps_avx(auVar99,auVar89);
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            auVar56._4_4_ = fVar24 * local_1400._4_4_;
            auVar56._0_4_ = fVar22 * local_1400._0_4_;
            auVar56._8_4_ = fVar26 * local_1400._8_4_;
            auVar56._12_4_ = fVar28 * local_1400._12_4_;
            auVar56._16_4_ = fVar30 * local_1400._16_4_;
            auVar56._20_4_ = fVar32 * local_1400._20_4_;
            auVar56._24_4_ = fVar34 * local_1400._24_4_;
            auVar56._28_4_ = auVar89._28_4_;
            auVar57._4_4_ = fVar23 * local_13a0._4_4_;
            auVar57._0_4_ = fVar21 * local_13a0._0_4_;
            auVar57._8_4_ = fVar25 * local_13a0._8_4_;
            auVar57._12_4_ = fVar27 * local_13a0._12_4_;
            auVar57._16_4_ = fVar29 * local_13a0._16_4_;
            auVar57._20_4_ = fVar31 * local_13a0._20_4_;
            auVar57._24_4_ = fVar33 * local_13a0._24_4_;
            auVar57._28_4_ = auVar99._28_4_;
            auVar111 = vfmsub213ps_fma(local_13a0,local_1100,auVar56);
            auVar58._4_4_ = fVar162 * auVar136._4_4_;
            auVar58._0_4_ = fVar159 * auVar136._0_4_;
            auVar58._8_4_ = fVar163 * auVar136._8_4_;
            auVar58._12_4_ = fVar164 * auVar136._12_4_;
            auVar58._16_4_ = fVar165 * auVar136._16_4_;
            auVar58._20_4_ = fVar166 * auVar136._20_4_;
            auVar58._24_4_ = fVar167 * auVar136._24_4_;
            auVar58._28_4_ = auVar112._28_4_;
            auVar139._0_4_ = fVar21 * auVar150._0_4_;
            auVar139._4_4_ = fVar23 * auVar150._4_4_;
            auVar139._8_4_ = fVar25 * auVar150._8_4_;
            auVar139._12_4_ = fVar27 * auVar150._12_4_;
            auVar139._16_4_ = fVar29 * auVar150._16_4_;
            auVar139._20_4_ = fVar31 * auVar150._20_4_;
            auVar139._24_4_ = fVar33 * auVar150._24_4_;
            auVar139._28_4_ = 0;
            auVar116 = vfmsub213ps_fma(auVar150,local_10e0,auVar58);
            auVar99 = vandps_avx(auVar56,auVar132);
            auVar89 = vandps_avx(auVar58,auVar132);
            auVar99 = vcmpps_avx(auVar99,auVar89,1);
            local_11c0 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar111),auVar99);
            auVar59._4_4_ = fVar24 * auVar36._4_4_;
            auVar59._0_4_ = fVar22 * auVar36._0_4_;
            auVar59._8_4_ = fVar26 * auVar36._8_4_;
            auVar59._12_4_ = fVar28 * auVar36._12_4_;
            auVar59._16_4_ = fVar30 * auVar36._16_4_;
            auVar59._20_4_ = fVar32 * auVar36._20_4_;
            auVar59._24_4_ = fVar34 * auVar36._24_4_;
            auVar59._28_4_ = auVar99._28_4_;
            auVar111 = vfmsub213ps_fma(auVar36,local_1100,auVar139);
            auVar60._4_4_ = auVar141._4_4_ * fVar162;
            auVar60._0_4_ = auVar141._0_4_ * fVar159;
            auVar60._8_4_ = auVar141._8_4_ * fVar163;
            auVar60._12_4_ = auVar141._12_4_ * fVar164;
            auVar60._16_4_ = auVar141._16_4_ * fVar165;
            auVar60._20_4_ = auVar141._20_4_ * fVar166;
            auVar60._24_4_ = auVar141._24_4_ * fVar167;
            auVar60._28_4_ = auVar89._28_4_;
            auVar116 = vfmsub213ps_fma(_local_1400,auVar35,auVar60);
            auVar99 = vandps_avx(auVar60,auVar132);
            auVar89 = vandps_avx(auVar139,auVar132);
            auVar99 = vcmpps_avx(auVar99,auVar89,1);
            local_11a0 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar116),auVar99);
            auVar111 = vfmsub213ps_fma(auVar141,local_10e0,auVar57);
            auVar116 = vfmsub213ps_fma(auVar136,auVar35,auVar59);
            auVar99 = vandps_avx(auVar57,auVar132);
            auVar89 = vandps_avx(auVar59,auVar132);
            auVar99 = vcmpps_avx(auVar99,auVar89,1);
            local_1180 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar111),auVar99);
            auVar111 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
            auVar61._4_4_ = local_1180._4_4_ * fStack_141c;
            auVar61._0_4_ = local_1180._0_4_ * fStack_141c;
            auVar61._8_4_ = local_1180._8_4_ * fStack_141c;
            auVar61._12_4_ = local_1180._12_4_ * fStack_141c;
            auVar61._16_4_ = local_1180._16_4_ * fStack_141c;
            auVar61._20_4_ = local_1180._20_4_ * fStack_141c;
            auVar61._24_4_ = local_1180._24_4_ * fStack_141c;
            auVar61._28_4_ = auVar117._28_4_;
            auVar116 = vfmadd213ps_fma(auVar155,local_11a0,auVar61);
            auVar116 = vfmadd213ps_fma(auVar169,local_11c0,ZEXT1632(auVar116));
            auVar117 = ZEXT1632(CONCAT412(auVar116._12_4_ + auVar116._12_4_,
                                          CONCAT48(auVar116._8_4_ + auVar116._8_4_,
                                                   CONCAT44(auVar116._4_4_ + auVar116._4_4_,
                                                            auVar116._0_4_ + auVar116._0_4_))));
            auVar115._0_4_ = local_1180._0_4_ * fVar1;
            auVar115._4_4_ = local_1180._4_4_ * fVar2;
            auVar115._8_4_ = local_1180._8_4_ * fVar3;
            auVar115._12_4_ = local_1180._12_4_ * fVar17;
            auVar115._16_4_ = local_1180._16_4_ * fVar18;
            auVar115._20_4_ = local_1180._20_4_ * fVar19;
            auVar115._24_4_ = local_1180._24_4_ * fVar20;
            auVar115._28_4_ = 0;
            auVar116 = vfmadd213ps_fma(auVar134,local_11a0,auVar115);
            auVar96 = vfmadd213ps_fma(auVar133,local_11c0,ZEXT1632(auVar116));
            auVar99 = vrcpps_avx(auVar117);
            auVar152._8_4_ = 0x3f800000;
            auVar152._0_8_ = &DAT_3f8000003f800000;
            auVar152._12_4_ = 0x3f800000;
            auVar152._16_4_ = 0x3f800000;
            auVar152._20_4_ = 0x3f800000;
            auVar152._24_4_ = 0x3f800000;
            auVar152._28_4_ = 0x3f800000;
            auVar116 = vfnmadd213ps_fma(auVar99,auVar117,auVar152);
            auVar116 = vfmadd132ps_fma(ZEXT1632(auVar116),auVar99,auVar99);
            auVar112 = ZEXT1632(CONCAT412(auVar116._12_4_ * (auVar96._12_4_ + auVar96._12_4_),
                                          CONCAT48(auVar116._8_4_ * (auVar96._8_4_ + auVar96._8_4_),
                                                   CONCAT44(auVar116._4_4_ *
                                                            (auVar96._4_4_ + auVar96._4_4_),
                                                            auVar116._0_4_ *
                                                            (auVar96._0_4_ + auVar96._0_4_)))));
            uVar88 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar140._4_4_ = uVar88;
            auVar140._0_4_ = uVar88;
            auVar140._8_4_ = uVar88;
            auVar140._12_4_ = uVar88;
            auVar140._16_4_ = uVar88;
            auVar140._20_4_ = uVar88;
            auVar140._24_4_ = uVar88;
            auVar140._28_4_ = uVar88;
            uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar148._4_4_ = uVar88;
            auVar148._0_4_ = uVar88;
            auVar148._8_4_ = uVar88;
            auVar148._12_4_ = uVar88;
            auVar148._16_4_ = uVar88;
            auVar148._20_4_ = uVar88;
            auVar148._24_4_ = uVar88;
            auVar148._28_4_ = uVar88;
            auVar99 = vcmpps_avx(auVar140,auVar112,2);
            auVar89 = vcmpps_avx(auVar112,auVar148,2);
            auVar99 = vandps_avx(auVar99,auVar89);
            auVar116 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
            auVar111 = vpand_avx(auVar116,auVar111);
            auVar99 = vpmovsxwd_avx2(auVar111);
            if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar99 >> 0x7f,0) != '\0') ||
                  (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar99 >> 0xbf,0) != '\0') ||
                (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar99[0x1f] < '\0') {
              auVar99 = vcmpps_avx(auVar117,_DAT_02020f00,4);
              auVar116 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
              auVar111 = vpand_avx(auVar111,auVar116);
              local_1240 = vpmovsxwd_avx2(auVar111);
              if ((((((((local_1240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1240 >> 0x7f,0) != '\0') ||
                    (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1240 >> 0xbf,0) != '\0') ||
                  (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1240[0x1f] < '\0') {
                uStack_12b0 = 0;
                uStack_12a8 = 0;
                local_1140._8_8_ = auVar98._8_8_;
                local_1280 = auVar98._0_8_;
                uStack_1278 = local_1140._8_8_;
                uStack_1270 = 0;
                uStack_1268 = 0;
                local_1260 = &local_1468;
                local_11e0 = auVar112;
                pGVar15 = (context->scene->geometries).items[local_13c0._4_4_].ptr;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar117 = ZEXT1632(CONCAT88(local_1140._8_8_,auVar98._0_8_));
                  auVar89 = vrcpps_avx(auVar117);
                  auVar99 = vandps_avx(auVar117,auVar132);
                  auVar125._8_4_ = 0x219392ef;
                  auVar125._0_8_ = 0x219392ef219392ef;
                  auVar125._12_4_ = 0x219392ef;
                  auVar125._16_4_ = 0x219392ef;
                  auVar125._20_4_ = 0x219392ef;
                  auVar125._24_4_ = 0x219392ef;
                  auVar125._28_4_ = 0x219392ef;
                  auVar99 = vcmpps_avx(auVar99,auVar125,5);
                  auVar126._8_4_ = 0x3f800000;
                  auVar126._0_8_ = &DAT_3f8000003f800000;
                  auVar126._12_4_ = 0x3f800000;
                  auVar126._16_4_ = 0x3f800000;
                  auVar126._20_4_ = 0x3f800000;
                  auVar126._24_4_ = 0x3f800000;
                  auVar126._28_4_ = 0x3f800000;
                  auVar111 = vfnmadd213ps_fma(auVar117,auVar89,auVar126);
                  auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar89,auVar89);
                  auVar99 = vandps_avx(auVar99,ZEXT1632(auVar111));
                  auVar101._0_4_ = auVar99._0_4_ * local_12c0._0_4_;
                  auVar101._4_4_ = auVar99._4_4_ * local_12c0._4_4_;
                  auVar101._8_4_ = auVar99._8_4_ * local_12c0._8_4_;
                  auVar101._12_4_ = auVar99._12_4_ * local_12c0._12_4_;
                  auVar101._16_4_ = auVar99._16_4_ * 0.0;
                  auVar101._20_4_ = auVar99._20_4_ * 0.0;
                  auVar101._24_4_ = auVar99._24_4_ * 0.0;
                  auVar101._28_4_ = 0;
                  auVar89 = vminps_avx(auVar101,auVar126);
                  auVar62._4_4_ = auVar99._4_4_ * auVar97._4_4_;
                  auVar62._0_4_ = auVar99._0_4_ * auVar97._0_4_;
                  auVar62._8_4_ = auVar99._8_4_ * auVar97._8_4_;
                  auVar62._12_4_ = auVar99._12_4_ * auVar97._12_4_;
                  auVar62._16_4_ = auVar99._16_4_ * 0.0;
                  auVar62._20_4_ = auVar99._20_4_ * 0.0;
                  auVar62._24_4_ = auVar99._24_4_ * 0.0;
                  auVar62._28_4_ = auVar99._28_4_;
                  auVar99 = vminps_avx(auVar62,auVar126);
                  auVar97 = *(undefined1 (*) [16])(local_1468 + local_1460 * 4);
                  auVar111 = auVar97;
                  if (2 < local_1458) {
                    auVar111 = *(undefined1 (*) [16])(local_1468 + local_1460 * 8);
                  }
                  auVar116 = *(undefined1 (*) [16])local_1468;
                  if (local_1460 == 2) {
                    auVar116 = vpshufd_avx(auVar116,0x54);
                    auVar97 = vpshufd_avx(auVar97,0x54);
                    auVar111 = vpshufd_avx(auVar111,0x54);
                  }
                  auVar130._0_16_ = ZEXT116(0) * auVar97 + ZEXT116(1) * auVar116;
                  auVar130._16_16_ = ZEXT116(1) * auVar97;
                  auVar119._0_16_ = ZEXT116(0) * auVar111 + ZEXT116(1) * auVar97;
                  auVar119._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar111;
                  auVar117 = vpunpckldq_avx2(auVar130,auVar119);
                  auVar134 = vpshufd_avx2(auVar130,0xa5);
                  auVar150 = vpshufd_avx2(auVar119,0x94);
                  auVar133 = vpsrld_avx2(auVar117,0x10);
                  auVar117 = vpblendw_avx2(auVar117,ZEXT1632((undefined1  [16])0x0),0xaa);
                  auVar117 = vcvtdq2ps_avx(auVar117);
                  auVar133 = vcvtdq2ps_avx(auVar133);
                  auVar136 = vpsrld_avx2(auVar134,0x10);
                  auVar134 = vpblendw_avx2(auVar134,ZEXT1632((undefined1  [16])0x0),0xaa);
                  auVar134 = vcvtdq2ps_avx(auVar134);
                  auVar136 = vcvtdq2ps_avx(auVar136);
                  auVar141 = vpsrld_avx2(auVar150,0x10);
                  auVar150 = vpblendw_avx2(auVar150,ZEXT1632((undefined1  [16])0x0),0xaa);
                  auVar150 = vcvtdq2ps_avx(auVar150);
                  auVar141 = vcvtdq2ps_avx(auVar141);
                  auVar131._0_4_ =
                       auVar141._0_4_ * 0.00012207031 * auVar99._0_4_ +
                       auVar89._0_4_ * auVar136._0_4_ * 0.00012207031;
                  auVar131._4_4_ =
                       auVar141._4_4_ * 0.00012207031 * auVar99._4_4_ +
                       auVar89._4_4_ * auVar136._4_4_ * 0.00012207031;
                  auVar131._8_4_ =
                       auVar141._8_4_ * 0.00012207031 * auVar99._8_4_ +
                       auVar89._8_4_ * auVar136._8_4_ * 0.00012207031;
                  auVar131._12_4_ =
                       auVar141._12_4_ * 0.00012207031 * auVar99._12_4_ +
                       auVar89._12_4_ * auVar136._12_4_ * 0.00012207031;
                  auVar131._16_4_ =
                       auVar141._16_4_ * 0.00012207031 * auVar99._16_4_ +
                       auVar89._16_4_ * auVar136._16_4_ * 0.00012207031;
                  auVar131._20_4_ =
                       auVar141._20_4_ * 0.00012207031 * auVar99._20_4_ +
                       auVar89._20_4_ * auVar136._20_4_ * 0.00012207031;
                  auVar131._24_4_ =
                       auVar141._24_4_ * 0.00012207031 * auVar99._24_4_ +
                       auVar89._24_4_ * auVar136._24_4_ * 0.00012207031;
                  auVar131._28_4_ = auVar134._28_4_ + auVar136._28_4_;
                  auVar137._8_4_ = 0x3f800000;
                  auVar137._0_8_ = &DAT_3f8000003f800000;
                  auVar137._12_4_ = 0x3f800000;
                  auVar137._16_4_ = 0x3f800000;
                  auVar137._20_4_ = 0x3f800000;
                  auVar137._24_4_ = 0x3f800000;
                  auVar137._28_4_ = 0x3f800000;
                  auVar136 = vsubps_avx(auVar137,auVar89);
                  auVar136 = vsubps_avx(auVar136,auVar99);
                  local_1220[1] =
                       auVar99._4_4_ * auVar150._4_4_ * 0.00012207031 +
                       auVar89._4_4_ * auVar134._4_4_ * 0.00012207031 +
                       auVar136._4_4_ * auVar117._4_4_ * 0.00012207031;
                  local_1220[0] =
                       auVar99._0_4_ * auVar150._0_4_ * 0.00012207031 +
                       auVar89._0_4_ * auVar134._0_4_ * 0.00012207031 +
                       auVar136._0_4_ * auVar117._0_4_ * 0.00012207031;
                  local_1220[2] =
                       auVar99._8_4_ * auVar150._8_4_ * 0.00012207031 +
                       auVar89._8_4_ * auVar134._8_4_ * 0.00012207031 +
                       auVar136._8_4_ * auVar117._8_4_ * 0.00012207031;
                  local_1220[3] =
                       auVar99._12_4_ * auVar150._12_4_ * 0.00012207031 +
                       auVar89._12_4_ * auVar134._12_4_ * 0.00012207031 +
                       auVar136._12_4_ * auVar117._12_4_ * 0.00012207031;
                  fStack_1210 = auVar99._16_4_ * auVar150._16_4_ * 0.00012207031 +
                                auVar89._16_4_ * auVar134._16_4_ * 0.00012207031 +
                                auVar136._16_4_ * auVar117._16_4_ * 0.00012207031;
                  fStack_120c = auVar99._20_4_ * auVar150._20_4_ * 0.00012207031 +
                                auVar89._20_4_ * auVar134._20_4_ * 0.00012207031 +
                                auVar136._20_4_ * auVar117._20_4_ * 0.00012207031;
                  fStack_1208 = auVar99._24_4_ * auVar150._24_4_ * 0.00012207031 +
                                auVar89._24_4_ * auVar134._24_4_ * 0.00012207031 +
                                auVar136._24_4_ * auVar117._24_4_ * 0.00012207031;
                  fStack_1204 = auVar150._28_4_ + auVar134._28_4_ + auVar99._28_4_;
                  local_1200[1] = auVar131._4_4_ + auVar136._4_4_ * auVar133._4_4_ * 0.00012207031;
                  local_1200[0] = auVar131._0_4_ + auVar136._0_4_ * auVar133._0_4_ * 0.00012207031;
                  local_1200[2] = auVar131._8_4_ + auVar136._8_4_ * auVar133._8_4_ * 0.00012207031;
                  local_1200[3] =
                       auVar131._12_4_ + auVar136._12_4_ * auVar133._12_4_ * 0.00012207031;
                  fStack_11f0 = auVar131._16_4_ + auVar136._16_4_ * auVar133._16_4_ * 0.00012207031;
                  fStack_11ec = auVar131._20_4_ + auVar136._20_4_ * auVar133._20_4_ * 0.00012207031;
                  fStack_11e8 = auVar131._24_4_ + auVar136._24_4_ * auVar133._24_4_ * 0.00012207031;
                  fStack_11e4 = auVar131._28_4_ + auVar136._28_4_;
                  auVar102._8_4_ = 0x7f800000;
                  auVar102._0_8_ = 0x7f8000007f800000;
                  auVar102._12_4_ = 0x7f800000;
                  auVar102._16_4_ = 0x7f800000;
                  auVar102._20_4_ = 0x7f800000;
                  auVar102._24_4_ = 0x7f800000;
                  auVar102._28_4_ = 0x7f800000;
                  auVar99 = vblendvps_avx(auVar102,auVar112,local_1240);
                  auVar89 = vshufps_avx(auVar99,auVar99,0xb1);
                  auVar89 = vminps_avx(auVar99,auVar89);
                  auVar117 = vshufpd_avx(auVar89,auVar89,5);
                  auVar89 = vminps_avx(auVar89,auVar117);
                  auVar117 = vpermpd_avx2(auVar89,0x4e);
                  auVar89 = vminps_avx(auVar89,auVar117);
                  auVar89 = vcmpps_avx(auVar99,auVar89,0);
                  auVar117 = local_1240 & auVar89;
                  auVar99 = local_1240;
                  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar117 >> 0x7f,0) != '\0') ||
                        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar117 >> 0xbf,0) != '\0') ||
                      (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar117[0x1f] < '\0') {
                    auVar99 = vandps_avx(auVar89,local_1240);
                  }
                  auVar89 = vpcmpeqd_avx2(auVar131,auVar131);
                  auVar94 = ZEXT3264(auVar89);
                  uVar79 = vmovmskps_avx(auVar99);
                  uVar13 = 0;
                  for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                    uVar13 = uVar13 + 1;
                  }
                  uVar82 = (ulong)uVar13;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar1 = local_1220[uVar82];
                    fVar2 = local_1200[uVar82];
                    uVar88 = *(undefined4 *)(local_11c0 + uVar82 * 4);
                    uVar4 = *(undefined4 *)(local_11a0 + uVar82 * 4);
                    uVar5 = *(undefined4 *)(local_1180 + uVar82 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar82 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar88;
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar5;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar1;
                    *(float *)(ray + k * 4 + 0x200) = fVar2;
                    *(undefined4 *)(ray + k * 4 + 0x220) = local_13e0._4_4_;
                    *(uint *)(ray + k * 4 + 0x240) = local_13c0._4_4_;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_13c0._0_4_ = local_13c0._4_4_;
                    uStack_13b8._0_4_ = local_13c0._4_4_;
                    uStack_13b8._4_4_ = local_13c0._4_4_;
                    uStack_13b0._0_4_ = local_13c0._4_4_;
                    uStack_13b0._4_4_ = local_13c0._4_4_;
                    uStack_13a8._0_4_ = local_13c0._4_4_;
                    uStack_13a8._4_4_ = local_13c0._4_4_;
                    local_13e0._0_4_ = local_13e0._4_4_;
                    uStack_13d8._0_4_ = local_13e0._4_4_;
                    uStack_13d8._4_4_ = local_13e0._4_4_;
                    uStack_13d0._0_4_ = local_13e0._4_4_;
                    uStack_13d0._4_4_ = local_13e0._4_4_;
                    uStack_13c8._0_4_ = local_13e0._4_4_;
                    uStack_13c8._4_4_ = local_13e0._4_4_;
                    local_1380 = local_1240;
                    local_1140 = auVar151;
                    do {
                      uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_1060 = local_1220[uVar82];
                      local_1040 = local_1200[uVar82];
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_11e0 + uVar82 * 4);
                      uVar4 = *(undefined4 *)(local_11c0 + uVar82 * 4);
                      uVar5 = *(undefined4 *)(local_11a0 + uVar82 * 4);
                      local_10a0._4_4_ = uVar5;
                      local_10a0._0_4_ = uVar5;
                      local_10a0._8_4_ = uVar5;
                      local_10a0._12_4_ = uVar5;
                      local_10a0._16_4_ = uVar5;
                      local_10a0._20_4_ = uVar5;
                      local_10a0._24_4_ = uVar5;
                      local_10a0._28_4_ = uVar5;
                      uVar5 = *(undefined4 *)(local_1180 + uVar82 * 4);
                      local_1080._4_4_ = uVar5;
                      local_1080._0_4_ = uVar5;
                      local_1080._8_4_ = uVar5;
                      local_1080._12_4_ = uVar5;
                      local_1080._16_4_ = uVar5;
                      local_1080._20_4_ = uVar5;
                      local_1080._24_4_ = uVar5;
                      local_1080._28_4_ = uVar5;
                      local_1450.context = context->user;
                      local_10c0[0] = (RTCHitN)(char)uVar4;
                      local_10c0[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_10c0[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_10c0[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_10c0[4] = (RTCHitN)(char)uVar4;
                      local_10c0[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_10c0[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_10c0[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_10c0[8] = (RTCHitN)(char)uVar4;
                      local_10c0[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_10c0[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_10c0[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_10c0[0xc] = (RTCHitN)(char)uVar4;
                      local_10c0[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_10c0[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_10c0[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_10c0[0x10] = (RTCHitN)(char)uVar4;
                      local_10c0[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_10c0[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_10c0[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_10c0[0x14] = (RTCHitN)(char)uVar4;
                      local_10c0[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_10c0[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_10c0[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_10c0[0x18] = (RTCHitN)(char)uVar4;
                      local_10c0[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      local_10c0[0x1c] = (RTCHitN)(char)uVar4;
                      local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
                      local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                      local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                      fStack_105c = local_1060;
                      fStack_1058 = local_1060;
                      fStack_1054 = local_1060;
                      fStack_1050 = local_1060;
                      fStack_104c = local_1060;
                      fStack_1048 = local_1060;
                      fStack_1044 = local_1060;
                      fStack_103c = local_1040;
                      fStack_1038 = local_1040;
                      fStack_1034 = local_1040;
                      fStack_1030 = local_1040;
                      fStack_102c = local_1040;
                      fStack_1028 = local_1040;
                      fStack_1024 = local_1040;
                      local_1020 = local_13e0;
                      uStack_1018 = uStack_13d8;
                      uStack_1010 = uStack_13d0;
                      uStack_1008 = uStack_13c8;
                      local_1000 = local_13c0;
                      uStack_ff8 = uStack_13b8;
                      uStack_ff0 = uStack_13b0;
                      uStack_fe8 = uStack_13a8;
                      uStack_fdc = (local_1450.context)->instID[0];
                      local_fe0 = uStack_fdc;
                      uStack_fd8 = uStack_fdc;
                      uStack_fd4 = uStack_fdc;
                      uStack_fd0 = uStack_fdc;
                      uStack_fcc = uStack_fdc;
                      uStack_fc8 = uStack_fdc;
                      uStack_fc4 = uStack_fdc;
                      uStack_fbc = (local_1450.context)->instPrimID[0];
                      local_fc0 = uStack_fbc;
                      uStack_fb8 = uStack_fbc;
                      uStack_fb4 = uStack_fbc;
                      uStack_fb0 = uStack_fbc;
                      uStack_fac = uStack_fbc;
                      uStack_fa8 = uStack_fbc;
                      uStack_fa4 = uStack_fbc;
                      local_1360 = local_1160._0_8_;
                      uStack_1358 = local_1160._8_8_;
                      uStack_1350 = local_1160._16_8_;
                      uStack_1348 = local_1160._24_8_;
                      local_1450.valid = (int *)&local_1360;
                      local_1450.geometryUserPtr = pGVar15->userPtr;
                      local_1450.hit = local_10c0;
                      local_1450.N = 8;
                      local_1450.ray = (RTCRayN *)ray;
                      if (pGVar15->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar99 = ZEXT1632(auVar94._0_16_);
                        (*pGVar15->intersectionFilterN)(&local_1450);
                        auVar99 = vpcmpeqd_avx2(auVar99,auVar99);
                        auVar94 = ZEXT3264(auVar99);
                      }
                      auVar71._8_8_ = uStack_1358;
                      auVar71._0_8_ = local_1360;
                      auVar71._16_8_ = uStack_1350;
                      auVar71._24_8_ = uStack_1348;
                      auVar89 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                      auVar99 = auVar94._0_32_ & ~auVar89;
                      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar99 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar99 >> 0x7f,0) == '\0') &&
                            (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar99 >> 0xbf,0) == '\0') &&
                          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar99[0x1f]) {
                        auVar89 = auVar89 ^ auVar94._0_32_;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar99 = ZEXT1632(auVar94._0_16_);
                          (*p_Var16)(&local_1450);
                          auVar99 = vpcmpeqd_avx2(auVar99,auVar99);
                          auVar94 = ZEXT3264(auVar99);
                        }
                        auVar72._8_8_ = uStack_1358;
                        auVar72._0_8_ = local_1360;
                        auVar72._16_8_ = uStack_1350;
                        auVar72._24_8_ = uStack_1348;
                        auVar117 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar72)
                        ;
                        auVar89 = auVar117 ^ auVar94._0_32_;
                        auVar99 = auVar94._0_32_ & ~auVar117;
                        if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar99 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar99 >> 0x7f,0) != '\0') ||
                              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar99 >> 0xbf,0) != '\0') ||
                            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar99[0x1f] < '\0') {
                          auVar103._0_4_ = auVar117._0_4_ ^ auVar94._0_4_;
                          auVar103._4_4_ = auVar117._4_4_ ^ auVar94._4_4_;
                          auVar103._8_4_ = auVar117._8_4_ ^ auVar94._8_4_;
                          auVar103._12_4_ = auVar117._12_4_ ^ auVar94._12_4_;
                          auVar103._16_4_ = auVar117._16_4_ ^ auVar94._16_4_;
                          auVar103._20_4_ = auVar117._20_4_ ^ auVar94._20_4_;
                          auVar103._24_4_ = auVar117._24_4_ ^ auVar94._24_4_;
                          auVar103._28_4_ = auVar117._28_4_ ^ auVar94._28_4_;
                          auVar99 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])local_1450.hit);
                          *(undefined1 (*) [32])(local_1450.ray + 0x180) = auVar99;
                          auVar99 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                             (local_1450.hit + 0x20));
                          *(undefined1 (*) [32])(local_1450.ray + 0x1a0) = auVar99;
                          auVar99 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                             (local_1450.hit + 0x40));
                          *(undefined1 (*) [32])(local_1450.ray + 0x1c0) = auVar99;
                          auVar99 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                             (local_1450.hit + 0x60));
                          *(undefined1 (*) [32])(local_1450.ray + 0x1e0) = auVar99;
                          auVar99 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])
                                                             (local_1450.hit + 0x80));
                          *(undefined1 (*) [32])(local_1450.ray + 0x200) = auVar99;
                          auVar99 = vpmaskmovd_avx2(auVar103,*(undefined1 (*) [32])
                                                              (local_1450.hit + 0xa0));
                          *(undefined1 (*) [32])(local_1450.ray + 0x220) = auVar99;
                          auVar99 = vpmaskmovd_avx2(auVar103,*(undefined1 (*) [32])
                                                              (local_1450.hit + 0xc0));
                          *(undefined1 (*) [32])(local_1450.ray + 0x240) = auVar99;
                          auVar99 = vpmaskmovd_avx2(auVar103,*(undefined1 (*) [32])
                                                              (local_1450.hit + 0xe0));
                          *(undefined1 (*) [32])(local_1450.ray + 0x260) = auVar99;
                          auVar99 = vpmaskmovd_avx2(auVar103,*(undefined1 (*) [32])
                                                              (local_1450.hit + 0x100));
                          *(undefined1 (*) [32])(local_1450.ray + 0x280) = auVar99;
                        }
                      }
                      if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar89 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar89 >> 0x7f,0) == '\0') &&
                            (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar89 >> 0xbf,0) == '\0') &&
                          (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar89[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar88;
                      }
                      *(undefined4 *)(local_1380 + uVar82 * 4) = 0;
                      uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar93._4_4_ = uVar88;
                      auVar93._0_4_ = uVar88;
                      auVar93._8_4_ = uVar88;
                      auVar93._12_4_ = uVar88;
                      auVar93._16_4_ = uVar88;
                      auVar93._20_4_ = uVar88;
                      auVar93._24_4_ = uVar88;
                      auVar93._28_4_ = uVar88;
                      auVar89 = vcmpps_avx(auVar112,auVar93,2);
                      auVar99 = vandps_avx(auVar89,local_1380);
                      local_1380 = local_1380 & auVar89;
                      bVar69 = (local_1380 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar70 = (local_1380 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar68 = (local_1380 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar67 = SUB321(local_1380 >> 0x7f,0) != '\0';
                      bVar66 = (local_1380 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar65 = SUB321(local_1380 >> 0xbf,0) != '\0';
                      bVar64 = (local_1380 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar63 = local_1380[0x1f] < '\0';
                      if (((((((bVar69 || bVar70) || bVar68) || bVar67) || bVar66) || bVar65) ||
                          bVar64) || bVar63) {
                        auVar104._8_4_ = 0x7f800000;
                        auVar104._0_8_ = 0x7f8000007f800000;
                        auVar104._12_4_ = 0x7f800000;
                        auVar104._16_4_ = 0x7f800000;
                        auVar104._20_4_ = 0x7f800000;
                        auVar104._24_4_ = 0x7f800000;
                        auVar104._28_4_ = 0x7f800000;
                        auVar89 = vblendvps_avx(auVar104,auVar112,auVar99);
                        auVar117 = vshufps_avx(auVar89,auVar89,0xb1);
                        auVar117 = vminps_avx(auVar89,auVar117);
                        auVar133 = vshufpd_avx(auVar117,auVar117,5);
                        auVar117 = vminps_avx(auVar117,auVar133);
                        auVar133 = vpermpd_avx2(auVar117,0x4e);
                        auVar117 = vminps_avx(auVar117,auVar133);
                        auVar117 = vcmpps_avx(auVar89,auVar117,0);
                        auVar133 = auVar99 & auVar117;
                        auVar89 = auVar99;
                        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar133 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar133 >> 0x7f,0) != '\0')
                              || (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar133 >> 0xbf,0) != '\0') ||
                            (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar133[0x1f] < '\0') {
                          auVar89 = vandps_avx(auVar117,auVar99);
                        }
                        uVar79 = vmovmskps_avx(auVar89);
                        uVar13 = 0;
                        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                          uVar13 = uVar13 + 1;
                        }
                        uVar82 = (ulong)uVar13;
                      }
                      local_1380 = auVar99;
                    } while (((((((bVar69 || bVar70) || bVar68) || bVar67) || bVar66) || bVar65) ||
                             bVar64) || bVar63);
                  }
                }
              }
            }
          }
          lVar78 = 0;
          auVar138 = ZEXT1664(local_12d0);
          auVar142 = ZEXT1664(local_12e0);
          auVar146 = ZEXT1664(local_12f0);
          auVar149 = ZEXT1664(local_1300);
          auVar153 = ZEXT1664(local_1310);
          auVar156 = ZEXT1664(local_1320);
          auVar158 = ZEXT1664(local_1330);
        }
        else {
          lVar78 = *(long *)*(GridSOA **)(uVar82 & 0xfffffffffffffff0);
          (pre->super_Precalculations).grid = *(GridSOA **)(uVar82 & 0xfffffffffffffff0);
        }
        uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar94 = ZEXT1664(CONCAT412(uVar88,CONCAT48(uVar88,CONCAT44(uVar88,uVar88))));
        if (lVar78 != 0) {
          *(long *)*pauVar81 = lVar78;
          *(undefined4 *)(*pauVar81 + 8) = 0;
          pauVar81 = pauVar81 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }